

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O1

void __thiscall
CTestGen9Resource_Test2DTileYsResource_Test::TestBody
          (CTestGen9Resource_Test2DTileYsResource_Test *this)

{
  uint uVar1;
  CTestGen9Resource_Test2DTileYsResource_Test *this_00;
  CTestGen9Resource_Test2DTileYsResource_Test *this_01;
  undefined4 uVar2;
  GMM_RESOURCE_INFO *pGVar3;
  ulong uVar4;
  uint *puVar5;
  uint32_t i_1;
  uint32_t *puVar6;
  long lVar7;
  uint32_t i;
  ulong uVar8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  uint *local_40;
  CTestGen9Resource_Test2DTileYsResource_Test *local_38;
  
  local_68 = 0;
  uStack_b0 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_c8 = 2;
  uStack_60 = 0x100000000;
  uStack_c0 = 0x400000000;
  local_b8 = 0x5000000000;
  puVar6 = &DAT_001ac6e0;
  lVar7 = 0;
  uVar8 = 0;
  local_38 = this;
  do {
    uVar2 = 0;
    if (uVar8 < 5) {
      uVar2 = *(undefined4 *)((long)&DAT_001ad0dc + lVar7);
    }
    local_c8 = CONCAT44(uVar2,(undefined4)local_c8);
    local_98 = 1;
    uStack_90 = CONCAT44(uStack_90._4_4_,1);
    pGVar3 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_c8);
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,pGVar3,*(uint32_t *)((long)&DAT_001ac6a0 + lVar7));
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,pGVar3,*(uint32_t *)((long)&DAT_001ac6c0 + lVar7));
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar3,*puVar6);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar3,1);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar3,0x10000);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar3);
    this_00 = local_38;
    uVar8 = uVar8 + 1;
    lVar7 = lVar7 + 4;
    puVar6 = puVar6 + 2;
  } while (uVar8 != 5);
  puVar5 = &DAT_001ac6e0;
  lVar7 = 0;
  uVar8 = 0;
  do {
    uVar2 = 0;
    if (uVar8 < 5) {
      uVar2 = *(undefined4 *)((long)&DAT_001ad0dc + lVar7);
    }
    local_c8 = CONCAT44(uVar2,(undefined4)local_c8);
    uVar4 = 0;
    if (uVar8 < 5) {
      uVar4 = (ulong)*(uint *)((long)&DAT_001ad0f0 + lVar7);
    }
    uVar1 = *puVar5;
    local_98 = (ulong)((int)(uVar1 / uVar4) + 1);
    uStack_90 = 0x100000001;
    local_40 = puVar5;
    pGVar3 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_c8,(ulong)uVar1 % uVar4);
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this_00,pGVar3,*(uint32_t *)((long)&DAT_001ac6a0 + lVar7));
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this_00,pGVar3,*(uint32_t *)((long)&DAT_001ac6c0 + lVar7));
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this_00,pGVar3,uVar1 * 2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this_00,pGVar3,2);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this_00,pGVar3,0x20000);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar3);
    this_01 = local_38;
    uVar8 = uVar8 + 1;
    lVar7 = lVar7 + 4;
    puVar5 = local_40 + 2;
  } while (uVar8 != 5);
  lVar7 = 0;
  uVar8 = 0;
  do {
    uVar2 = 0;
    if (uVar8 < 5) {
      uVar2 = *(undefined4 *)((long)&DAT_001ad0dc + lVar7);
    }
    local_c8 = CONCAT44(uVar2,(undefined4)local_c8);
    uVar4 = 0;
    if (uVar8 < 5) {
      uVar4 = (ulong)*(uint *)((long)&DAT_001ad0f0 + lVar7);
    }
    uVar1 = *(uint *)((long)&DAT_001ac6e0 + lVar7 * 2);
    local_98 = (ulong)((int)(uVar1 / uVar4) + 1);
    uStack_90 = CONCAT44(1,*(int *)((long)&DAT_001ac6e4 + lVar7 * 2) + 1);
    pGVar3 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_c8,(ulong)uVar1 % uVar4);
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this_01,pGVar3,*(uint32_t *)((long)&DAT_001ac6a0 + lVar7));
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this_01,pGVar3,*(uint32_t *)((long)&DAT_001ac6c0 + lVar7));
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this_01,pGVar3,uVar1 * 2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this_01,pGVar3,2);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this_01,pGVar3,0x40000);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar3);
    uVar8 = uVar8 + 1;
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x14);
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test2DTileYsResource)
{

    const uint32_t HAlign[TEST_BPP_MAX] = {256, 256, 128, 128, 64};
    const uint32_t VAlign[TEST_BPP_MAX] = {256, 128, 128, 64, 64};

    const uint32_t TileSize[TEST_BPP_MAX][2] = {{256, 256},
                                                {512, 128},
                                                {512, 128},
                                                {1024, 64},
                                                {1024, 64}};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_2D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledY    = 1;
    gmmParams.Flags.Info.TiledYs   = 1;
    gmmParams.Flags.Gpu.Texture    = 1;

    //Allocate 1x1 surface
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1;
        gmmParams.BaseHeight  = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0]); // As wide as 1 Tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 1);       // 1 Tile wide
        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(64));   // 1 Tile Big
        VerifyResourceQPitch<false>(ResourceInfo, 0);            // Not Tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate surface that requires multi tiles in two dimension
    // Allocate 2 tiles in X dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = 0x1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0] * 2); // As wide as 2 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);           // 2 tile wide
        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(64) * 2);   // 2 tile big

        VerifyResourceQPitch<false>(ResourceInfo, 0); // Not tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X/Y dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = TileSize[i][1] + 1;                      // 1 row larger than 1 tile height
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0] * 2); // As wide as 2 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);           // 2 tile wide
        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(64) * 4);   // 4 tile big

        VerifyResourceQPitch<false>(ResourceInfo, 0); // Not tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}